

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O3

int ThreadPoolGetAttr(ThreadPool *tp,ThreadPoolAttr *out)

{
  size_t sVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = 0x16;
  if (out != (ThreadPoolAttr *)0x0 && tp != (ThreadPool *)0x0) {
    if (tp->shutdown == 0) {
      pthread_mutex_lock((pthread_mutex_t *)tp);
    }
    uVar2 = *(undefined4 *)&(tp->attr).field_0x24;
    out->schedPolicy = (tp->attr).schedPolicy;
    *(undefined4 *)&out->field_0x24 = uVar2;
    iVar5 = (tp->attr).minThreads;
    iVar6 = (tp->attr).maxThreads;
    sVar1 = (tp->attr).stackSize;
    iVar7 = (tp->attr).jobsPerThread;
    iVar3 = (tp->attr).maxJobsTotal;
    iVar4 = (tp->attr).starvationTime;
    out->maxIdleTime = (tp->attr).maxIdleTime;
    out->jobsPerThread = iVar7;
    out->maxJobsTotal = iVar3;
    out->starvationTime = iVar4;
    out->minThreads = iVar5;
    out->maxThreads = iVar6;
    out->stackSize = sVar1;
    iVar7 = 0;
    if (tp->shutdown == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)tp);
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int ThreadPoolGetAttr(ThreadPool *tp, ThreadPoolAttr *out)
{
	if (!tp || !out)
		return EINVAL;
	if (!tp->shutdown)
		ithread_mutex_lock(&tp->mutex);
	*out = tp->attr;
	if (!tp->shutdown)
		ithread_mutex_unlock(&tp->mutex);

	return 0;
}